

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

DisasJumpType op_cs(DisasContext_conflict13 *s,DisasOps *o)

{
  TCGContext_conflict12 *tcg_ctx;
  TCGv_i64 retv;
  TCGv_i64 newv;
  int d2;
  int b2;
  uint uVar1;
  TCGv_i64 addr;
  TCGv_i64 pTVar2;
  uintptr_t o_1;
  
  tcg_ctx = s->uc->tcg_ctx;
  d2 = get_field1(s,FLD_O_d2,FLD_C_d2);
  b2 = get_field1(s,FLD_O_b2,FLD_C_b2);
  addr = get_address(s,0,b2,d2);
  pTVar2 = o->in2;
  retv = o->out;
  newv = o->in1;
  uVar1 = get_mem_index(s);
  tcg_gen_atomic_cmpxchg_i64_s390x
            (tcg_ctx,retv,addr,pTVar2,newv,(ulong)uVar1,(MemOp_conflict)s->insn->data | MO_ALIGN);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(addr + (long)tcg_ctx));
  pTVar2 = tcg_temp_new_i64(tcg_ctx);
  tcg_gen_setcond_i64_s390x(tcg_ctx,TCG_COND_NE,pTVar2,o->in2,o->out);
  tcg_gen_extrl_i64_i32_s390x(tcg_ctx,tcg_ctx->cc_op,pTVar2);
  tcg_temp_free_internal_s390x(tcg_ctx,(TCGTemp *)(pTVar2 + (long)tcg_ctx));
  set_cc_static(s);
  return DISAS_NEXT;
}

Assistant:

static DisasJumpType op_cs(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    int d2 = get_field(s, d2);
    int b2 = get_field(s, b2);
    TCGv_i64 addr, cc;

    /* Note that in1 = R3 (new value) and
       in2 = (zero-extended) R1 (expected value).  */

    addr = get_address(s, 0, b2, d2);
    tcg_gen_atomic_cmpxchg_i64(tcg_ctx, o->out, addr, o->in2, o->in1,
                               get_mem_index(s), s->insn->data | MO_ALIGN);
    tcg_temp_free_i64(tcg_ctx, addr);

    /* Are the memory and expected values (un)equal?  Note that this setcond
       produces the output CC value, thus the NE sense of the test.  */
    cc = tcg_temp_new_i64(tcg_ctx);
    tcg_gen_setcond_i64(tcg_ctx, TCG_COND_NE, cc, o->in2, o->out);
    tcg_gen_extrl_i64_i32(tcg_ctx, tcg_ctx->cc_op, cc);
    tcg_temp_free_i64(tcg_ctx, cc);
    set_cc_static(s);

    return DISAS_NEXT;
}